

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise.cpp
# Opt level: O1

int __thiscall
ncnn::Eltwise::forward
          (Eltwise *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  float fVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  Mat *m;
  Mat *this_00;
  pointer pMVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  uint uVar14;
  void *pvVar15;
  void *pvVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  float fVar22;
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  uVar4 = m->c;
  uVar19 = (ulong)uVar4;
  uVar14 = m->h * m->w;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  iVar5 = this->op_type;
  if (iVar5 == 2) {
    if (0 < (int)uVar4) {
      pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pvVar13 = m->data;
      sVar7 = m->cstep;
      pvVar15 = pMVar6[1].data;
      sVar8 = pMVar6[1].cstep;
      pvVar16 = this_00->data;
      sVar9 = this_00->cstep;
      sVar10 = this_00->elemsize;
      sVar11 = pMVar6[1].elemsize;
      sVar12 = m->elemsize;
      uVar17 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar21 = 0;
          do {
            fVar22 = *(float *)((long)pvVar15 + uVar21 * 4);
            fVar2 = *(float *)((long)pvVar13 + uVar21 * 4);
            if (fVar22 <= fVar2) {
              fVar22 = fVar2;
            }
            *(float *)((long)pvVar16 + uVar21 * 4) = fVar22;
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
        }
        uVar17 = uVar17 + 1;
        pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar10);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar12);
      } while (uVar17 != uVar19);
    }
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar17 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 3) *
             -0x71c71c71c71c71c7;
    if (uVar17 < 3) {
      return 0;
    }
    uVar21 = 2;
    do {
      if (0 < (int)uVar4) {
        pMVar1 = pMVar6 + uVar21;
        pvVar13 = pMVar1->data;
        sVar7 = pMVar1->cstep;
        sVar8 = pMVar1->elemsize;
        pvVar15 = this_00->data;
        sVar9 = this_00->cstep;
        sVar10 = this_00->elemsize;
        uVar18 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar20 = 0;
            do {
              fVar22 = *(float *)((long)pvVar13 + uVar20 * 4);
              fVar2 = *(float *)((long)pvVar15 + uVar20 * 4);
              if (fVar22 <= fVar2) {
                fVar22 = fVar2;
              }
              *(float *)((long)pvVar15 + uVar20 * 4) = fVar22;
              uVar20 = uVar20 + 1;
            } while (uVar14 != uVar20);
          }
          uVar18 = uVar18 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar9 * sVar10);
        } while (uVar18 != uVar19);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar17);
  }
  else {
    if (iVar5 == 1) {
      pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->coeffs).w != 0) {
        if (0 < (int)uVar4) {
          uVar3 = *(this->coeffs).data;
          pvVar13 = m->data;
          sVar7 = m->cstep;
          pvVar15 = pMVar6[1].data;
          sVar8 = pMVar6[1].cstep;
          pvVar16 = this_00->data;
          sVar9 = this_00->cstep;
          sVar10 = this_00->elemsize;
          sVar11 = pMVar6[1].elemsize;
          sVar12 = m->elemsize;
          uVar17 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar21 = 0;
              do {
                *(float *)((long)pvVar16 + uVar21 * 4) =
                     *(float *)((long)pvVar15 + uVar21 * 4) * (float)((ulong)uVar3 >> 0x20) +
                     *(float *)((long)pvVar13 + uVar21 * 4) * (float)uVar3;
                uVar21 = uVar21 + 1;
              } while (uVar14 != uVar21);
            }
            uVar17 = uVar17 + 1;
            pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar10);
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar12);
          } while (uVar17 != uVar19);
        }
        pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar17 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 3) *
                 -0x71c71c71c71c71c7;
        if (uVar17 < 3) {
          return 0;
        }
        pvVar13 = (this->coeffs).data;
        uVar21 = 2;
        do {
          if (0 < (int)uVar4) {
            pMVar1 = pMVar6 + uVar21;
            fVar22 = *(float *)((long)pvVar13 + uVar21 * 4);
            pvVar15 = pMVar1->data;
            sVar7 = pMVar1->cstep;
            sVar8 = pMVar1->elemsize;
            pvVar16 = this_00->data;
            sVar9 = this_00->cstep;
            sVar10 = this_00->elemsize;
            uVar18 = 0;
            do {
              if (0 < (int)uVar14) {
                uVar20 = 0;
                do {
                  *(float *)((long)pvVar16 + uVar20 * 4) =
                       *(float *)((long)pvVar15 + uVar20 * 4) * fVar22 +
                       *(float *)((long)pvVar16 + uVar20 * 4);
                  uVar20 = uVar20 + 1;
                } while (uVar14 != uVar20);
              }
              uVar18 = uVar18 + 1;
              pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar10);
              pvVar15 = (void *)((long)pvVar15 + sVar7 * sVar8);
            } while (uVar18 != uVar19);
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar17);
        return 0;
      }
      if (0 < (int)uVar4) {
        pvVar13 = m->data;
        sVar7 = m->cstep;
        pvVar15 = pMVar6[1].data;
        sVar8 = pMVar6[1].cstep;
        pvVar16 = this_00->data;
        sVar9 = this_00->cstep;
        sVar10 = this_00->elemsize;
        sVar11 = pMVar6[1].elemsize;
        sVar12 = m->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar21 = 0;
            do {
              *(float *)((long)pvVar16 + uVar21 * 4) =
                   *(float *)((long)pvVar15 + uVar21 * 4) + *(float *)((long)pvVar13 + uVar21 * 4);
              uVar21 = uVar21 + 1;
            } while (uVar14 != uVar21);
          }
          uVar17 = uVar17 + 1;
          pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar10);
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar12);
        } while (uVar17 != uVar19);
      }
      pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar17 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 3) *
               -0x71c71c71c71c71c7;
      if (uVar17 < 3) {
        return 0;
      }
      uVar21 = 2;
      do {
        if (0 < (int)uVar4) {
          pMVar1 = pMVar6 + uVar21;
          pvVar13 = pMVar1->data;
          sVar7 = pMVar1->cstep;
          sVar8 = pMVar1->elemsize;
          pvVar15 = this_00->data;
          sVar9 = this_00->cstep;
          sVar10 = this_00->elemsize;
          uVar18 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar20 = 0;
              do {
                *(float *)((long)pvVar15 + uVar20 * 4) =
                     *(float *)((long)pvVar15 + uVar20 * 4) + *(float *)((long)pvVar13 + uVar20 * 4)
                ;
                uVar20 = uVar20 + 1;
              } while (uVar14 != uVar20);
            }
            uVar18 = uVar18 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar9 * sVar10);
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar8);
          } while (uVar18 != uVar19);
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != uVar17);
      return 0;
    }
    if (iVar5 != 0) {
      return 0;
    }
    if (0 < (int)uVar4) {
      pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pvVar13 = m->data;
      sVar7 = m->cstep;
      pvVar15 = pMVar6[1].data;
      sVar8 = pMVar6[1].cstep;
      sVar9 = this_00->cstep;
      sVar10 = this_00->elemsize;
      sVar11 = pMVar6[1].elemsize;
      pvVar16 = this_00->data;
      sVar12 = m->elemsize;
      uVar17 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar21 = 0;
          do {
            *(float *)((long)pvVar16 + uVar21 * 4) =
                 *(float *)((long)pvVar15 + uVar21 * 4) * *(float *)((long)pvVar13 + uVar21 * 4);
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
        }
        uVar17 = uVar17 + 1;
        pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar10);
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar11);
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar12);
      } while (uVar17 != uVar19);
    }
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar17 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 3) *
             -0x71c71c71c71c71c7;
    if (uVar17 < 3) {
      return 0;
    }
    uVar21 = 2;
    do {
      if (0 < (int)uVar4) {
        pMVar1 = pMVar6 + uVar21;
        pvVar13 = pMVar1->data;
        sVar7 = pMVar1->cstep;
        sVar8 = pMVar1->elemsize;
        pvVar15 = this_00->data;
        sVar9 = this_00->cstep;
        sVar10 = this_00->elemsize;
        uVar18 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar20 = 0;
            do {
              *(float *)((long)pvVar15 + uVar20 * 4) =
                   *(float *)((long)pvVar15 + uVar20 * 4) * *(float *)((long)pvVar13 + uVar20 * 4);
              uVar20 = uVar20 + 1;
            } while (uVar14 != uVar20);
          }
          uVar18 = uVar18 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar9 * sVar10);
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar8);
        } while (uVar18 != uVar19);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar17);
  }
  return 0;
}

Assistant:

int Eltwise::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int size = w * h;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = ptr[i] * ptr1[i];
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob1 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] *= ptr[i];
                }
            }
        }
    }
    else if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = ptr[i] + ptr1[i];
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob1 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] += ptr[i];
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = ptr[i] * coeff0 + ptr1[i] * coeff1;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob1 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] += ptr[i] * coeff;
                    }
                }
            }
        }
    }
    else if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = std::max(ptr[i], ptr1[i]);
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob1 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = std::max(outptr[i], ptr[i]);
                }
            }
        }
    }

    return 0;
}